

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_lex.c
# Opt level: O1

yajl_tok yajl_lex_lex(yajl_lexer lexer,uchar *jsonText,size_t jsonTextLen,size_t *offset,
                     uchar **outBuf,size_t *outLen)

{
  uchar uVar1;
  byte bVar2;
  size_t sVar3;
  uchar *puVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  uint uVar8;
  char *pcVar9;
  size_t *psVar10;
  size_t *psVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  yajl_tok yVar15;
  long lVar16;
  long lVar17;
  size_t *psVar18;
  byte bVar19;
  bool bVar20;
  bool bVar21;
  yajl_tok local_70;
  yajl_tok local_60;
  
  sVar5 = *offset;
  *outBuf = (uchar *)0x0;
  *outLen = 0;
  if (*offset < jsonTextLen) {
    psVar11 = &lexer->bufOff;
    do {
      puVar4 = jsonText;
      psVar10 = offset;
      if (((lexer->bufInUse != 0) && (sVar3 = yajl_buf_len(lexer->buf), sVar3 != 0)) &&
         (uVar7 = lexer->bufOff, sVar3 = yajl_buf_len(lexer->buf), uVar7 < sVar3)) {
        puVar4 = yajl_buf_data(lexer->buf);
        psVar10 = psVar11;
      }
      sVar3 = *psVar10;
      *psVar10 = sVar3 + 1;
      bVar2 = puVar4[sVar3];
      if (0x5a < bVar2) {
        if (bVar2 < 0x6e) {
          if (bVar2 == 0x5b) {
            local_60 = yajl_tok_left_brace;
            goto LAB_00103336;
          }
          if (bVar2 == 0x5d) {
            local_60 = yajl_tok_right_brace;
            goto LAB_00103336;
          }
          if (bVar2 == 0x66) {
            lVar14 = 0;
            goto LAB_0010365c;
          }
        }
        else if (bVar2 < 0x7b) {
          if (bVar2 == 0x6e) {
            lVar14 = 0;
            goto LAB_00103fc2;
          }
          if (bVar2 == 0x74) {
            lVar14 = 0;
            goto LAB_0010359a;
          }
        }
        else {
          if (bVar2 == 0x7b) {
            local_60 = yajl_tok_left_bracket;
            goto LAB_00103336;
          }
          if (bVar2 == 0x7d) {
            local_60 = yajl_tok_right_bracket;
            goto LAB_00103336;
          }
        }
switchD_001030a9_caseD_e:
        lexer->error = yajl_lex_invalid_char;
        goto LAB_001040d2;
      }
      switch(bVar2) {
      case 9:
      case 10:
      case 0xb:
      case 0xc:
      case 0xd:
      case 0x20:
        sVar5 = sVar5 + 1;
        break;
      default:
        goto switchD_001030a9_caseD_e;
      case 0x22:
        psVar11 = &lexer->bufOff;
        bVar20 = false;
        local_70 = yajl_tok_error;
        goto LAB_001038b7;
      case 0x2c:
        local_60 = yajl_tok_comma;
        goto LAB_00103336;
      case 0x2d:
      case 0x30:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
        sVar3 = *offset;
        psVar11 = offset;
        if (sVar3 == 0) {
          psVar11 = &lexer->bufOff;
          sVar3 = lexer->bufOff;
        }
        *psVar11 = sVar3 - 1;
        if (jsonTextLen <= *offset) goto LAB_00103331;
        puVar4 = jsonText;
        psVar11 = offset;
        if (((lexer->bufInUse != 0) && (sVar3 = yajl_buf_len(lexer->buf), sVar3 != 0)) &&
           (uVar7 = lexer->bufOff, sVar3 = yajl_buf_len(lexer->buf), uVar7 < sVar3)) {
          psVar11 = &lexer->bufOff;
          puVar4 = yajl_buf_data(lexer->buf);
        }
        sVar3 = *psVar11;
        *psVar11 = sVar3 + 1;
        uVar1 = puVar4[sVar3];
        if (uVar1 == '-') {
          if (jsonTextLen <= *offset) goto LAB_00103331;
          puVar4 = jsonText;
          psVar11 = offset;
          if (((lexer->bufInUse != 0) && (sVar3 = yajl_buf_len(lexer->buf), sVar3 != 0)) &&
             (uVar7 = lexer->bufOff, sVar3 = yajl_buf_len(lexer->buf), uVar7 < sVar3)) {
            psVar11 = &lexer->bufOff;
            puVar4 = yajl_buf_data(lexer->buf);
          }
          sVar3 = *psVar11;
          *psVar11 = sVar3 + 1;
          uVar1 = puVar4[sVar3];
        }
        if (uVar1 != '0') {
          if ((byte)(uVar1 - 0x31) < 9) {
            goto LAB_00103712;
          }
          sVar3 = *offset;
          psVar11 = offset;
          if (sVar3 == 0) {
            psVar11 = &lexer->bufOff;
            sVar3 = lexer->bufOff;
          }
          *psVar11 = sVar3 - 1;
          lexer->error = yajl_lex_missing_integer_after_minus;
          goto LAB_001040d2;
        }
        if (*offset < jsonTextLen) {
          puVar4 = jsonText;
          psVar11 = offset;
          if (((lexer->bufInUse != 0) && (sVar3 = yajl_buf_len(lexer->buf), sVar3 != 0)) &&
             (uVar7 = lexer->bufOff, sVar3 = yajl_buf_len(lexer->buf), uVar7 < sVar3)) {
            psVar11 = &lexer->bufOff;
            puVar4 = yajl_buf_data(lexer->buf);
          }
          sVar3 = *psVar11;
          *psVar11 = sVar3 + 1;
          bVar2 = puVar4[sVar3];
          goto LAB_00103786;
        }
        goto LAB_00103331;
      case 0x2f:
        uVar7 = *offset;
        if (lexer->allowComments == 0) {
          psVar11 = offset;
          if (uVar7 == 0) {
            psVar11 = &lexer->bufOff;
            uVar7 = lexer->bufOff;
          }
          *psVar11 = uVar7 - 1;
          lexer->error = yajl_lex_unallowed_comment;
          goto LAB_001040d2;
        }
        yVar15 = yajl_tok_eof;
        local_60 = yajl_tok_eof;
        if (uVar7 < jsonTextLen) {
          puVar4 = jsonText;
          psVar10 = offset;
          if (((lexer->bufInUse != 0) && (sVar3 = yajl_buf_len(lexer->buf), sVar3 != 0)) &&
             (uVar7 = lexer->bufOff, sVar3 = yajl_buf_len(lexer->buf), uVar7 < sVar3)) {
            puVar4 = yajl_buf_data(lexer->buf);
            psVar10 = psVar11;
          }
          sVar3 = *psVar10;
          *psVar10 = sVar3 + 1;
          if (puVar4[sVar3] == '*') {
            while (*offset < jsonTextLen) {
              puVar4 = jsonText;
              psVar10 = offset;
              if (((lexer->bufInUse != 0) && (sVar3 = yajl_buf_len(lexer->buf), sVar3 != 0)) &&
                 (uVar7 = lexer->bufOff, sVar3 = yajl_buf_len(lexer->buf), uVar7 < sVar3)) {
                puVar4 = yajl_buf_data(lexer->buf);
                psVar10 = psVar11;
              }
              sVar3 = *psVar10;
              *psVar10 = sVar3 + 1;
              if (puVar4[sVar3] == '*') {
                if (jsonTextLen <= *offset) break;
                puVar4 = jsonText;
                psVar10 = offset;
                if (((lexer->bufInUse != 0) && (sVar3 = yajl_buf_len(lexer->buf), sVar3 != 0)) &&
                   (uVar7 = lexer->bufOff, sVar3 = yajl_buf_len(lexer->buf), uVar7 < sVar3)) {
                  puVar4 = yajl_buf_data(lexer->buf);
                  psVar10 = psVar11;
                }
                sVar3 = *psVar10;
                *psVar10 = sVar3 + 1;
                if (puVar4[sVar3] == '/') {
                  local_60 = yajl_tok_comment;
                  bVar20 = true;
                  goto LAB_001032fd;
                }
                sVar3 = *offset;
                psVar10 = offset;
                if (sVar3 == 0) {
                  sVar3 = *psVar11;
                  psVar10 = psVar11;
                }
                *psVar10 = sVar3 - 1;
              }
            }
            goto LAB_001032fa;
          }
          if (puVar4[sVar3] != '/') {
            lexer->error = yajl_lex_invalid_char;
            yVar15 = yajl_tok_error;
            goto LAB_001032fa;
          }
          do {
            bVar20 = *offset < jsonTextLen;
            if (!bVar20) goto LAB_001032fd;
            puVar4 = jsonText;
            psVar10 = offset;
            if (((lexer->bufInUse != 0) && (sVar3 = yajl_buf_len(lexer->buf), sVar3 != 0)) &&
               (uVar7 = lexer->bufOff, sVar3 = yajl_buf_len(lexer->buf), uVar7 < sVar3)) {
              puVar4 = yajl_buf_data(lexer->buf);
              psVar10 = psVar11;
            }
            sVar3 = *psVar10;
            *psVar10 = sVar3 + 1;
          } while (puVar4[sVar3] != '\n');
          local_60 = yajl_tok_comment;
        }
        else {
LAB_001032fa:
          local_60 = yVar15;
          bVar20 = false;
        }
LAB_001032fd:
        if (!bVar20) goto LAB_00103336;
        yajl_buf_clear(lexer->buf);
        lexer->bufInUse = 0;
        sVar5 = *offset;
        break;
      case 0x3a:
        local_60 = yajl_tok_colon;
        goto LAB_00103336;
      }
    } while (*offset < jsonTextLen);
  }
LAB_00103331:
  local_60 = yajl_tok_eof;
  goto LAB_00103336;
  while( true ) {
    puVar4 = jsonText;
    psVar11 = offset;
    if (((lexer->bufInUse != 0) && (sVar3 = yajl_buf_len(lexer->buf), sVar3 != 0)) &&
       (uVar7 = lexer->bufOff, sVar3 = yajl_buf_len(lexer->buf), uVar7 < sVar3)) {
      puVar4 = yajl_buf_data(lexer->buf);
      psVar11 = &lexer->bufOff;
    }
    sVar3 = *psVar11;
    *psVar11 = sVar3 + 1;
    if ((uint)puVar4[sVar3] != (int)"alse"[lVar14]) goto LAB_00104070;
    lVar14 = lVar14 + 1;
    local_60 = yajl_tok_bool;
    if (lVar14 == 4) break;
LAB_0010365c:
    if (jsonTextLen <= *offset) goto LAB_00104042;
  }
  goto LAB_00103336;
  while( true ) {
    puVar4 = jsonText;
    psVar11 = offset;
    if (((lexer->bufInUse != 0) && (sVar3 = yajl_buf_len(lexer->buf), sVar3 != 0)) &&
       (uVar7 = lexer->bufOff, sVar3 = yajl_buf_len(lexer->buf), uVar7 < sVar3)) {
      puVar4 = yajl_buf_data(lexer->buf);
      psVar11 = &lexer->bufOff;
    }
    sVar3 = *psVar11;
    *psVar11 = sVar3 + 1;
    if ((uint)puVar4[sVar3] != (int)"ull"[lVar14]) goto LAB_00104070;
    lVar14 = lVar14 + 1;
    local_60 = yajl_tok_null;
    if (lVar14 == 3) break;
LAB_00103fc2:
    if (jsonTextLen <= *offset) goto LAB_00104042;
  }
  goto LAB_00103336;
  while( true ) {
    puVar4 = jsonText;
    psVar11 = offset;
    if (((lexer->bufInUse != 0) && (sVar3 = yajl_buf_len(lexer->buf), sVar3 != 0)) &&
       (uVar7 = lexer->bufOff, sVar3 = yajl_buf_len(lexer->buf), uVar7 < sVar3)) {
      puVar4 = yajl_buf_data(lexer->buf);
      psVar11 = &lexer->bufOff;
    }
    sVar3 = *psVar11;
    *psVar11 = sVar3 + 1;
    if ((uint)puVar4[sVar3] != (int)"rue"[lVar14]) goto LAB_00104070;
    lVar14 = lVar14 + 1;
    local_60 = yajl_tok_bool;
    if (lVar14 == 3) break;
LAB_0010359a:
    if (jsonTextLen <= *offset) goto LAB_00104042;
  }
  goto LAB_00103336;
LAB_00104042:
  local_60 = yajl_tok_eof;
  goto LAB_00103336;
LAB_00104070:
  sVar3 = *offset;
  psVar11 = offset;
  if (sVar3 == 0) {
    psVar11 = &lexer->bufOff;
    sVar3 = lexer->bufOff;
  }
  *psVar11 = sVar3 - 1;
  lexer->error = yajl_lex_invalid_string;
  local_60 = yajl_tok_error;
  goto LAB_00103336;
  while( true ) {
    puVar4 = jsonText;
    psVar11 = offset;
    if (((lexer->bufInUse != 0) && (sVar3 = yajl_buf_len(lexer->buf), sVar3 != 0)) &&
       (uVar7 = lexer->bufOff, sVar3 = yajl_buf_len(lexer->buf), uVar7 < sVar3)) {
      puVar4 = yajl_buf_data(lexer->buf);
      psVar11 = &lexer->bufOff;
    }
    sVar3 = *psVar11;
    *psVar11 = sVar3 + 1;
    bVar2 = puVar4[sVar3];
    if (9 < (byte)(bVar2 - 0x30)) break;
LAB_00103712:
    if (jsonTextLen <= *offset) goto LAB_00103331;
  }
LAB_00103786:
  yVar15 = yajl_tok_integer;
  if (bVar2 == 0x2e) {
    local_60 = yajl_tok_eof;
    yVar15 = yajl_tok_eof;
    if (*offset < jsonTextLen) {
      puVar4 = jsonText;
      psVar11 = offset;
      if (((lexer->bufInUse != 0) && (sVar3 = yajl_buf_len(lexer->buf), sVar3 != 0)) &&
         (uVar7 = lexer->bufOff, sVar3 = yajl_buf_len(lexer->buf), uVar7 < sVar3)) {
        psVar11 = &lexer->bufOff;
        puVar4 = yajl_buf_data(lexer->buf);
      }
      sVar3 = *psVar11;
      *psVar11 = sVar3 + 1;
      bVar2 = puVar4[sVar3];
      bVar19 = bVar2 - 0x3a;
      if (bVar19 < 0xf6) {
LAB_0010381f:
        if (bVar19 < 0xf6) {
          sVar3 = *offset;
          psVar11 = offset;
          if (sVar3 == 0) {
            psVar11 = &lexer->bufOff;
            sVar3 = lexer->bufOff;
          }
          *psVar11 = sVar3 - 1;
          lexer->error = yajl_lex_missing_integer_after_decimal;
          yVar15 = yajl_tok_error;
          goto LAB_00103858;
        }
        bVar20 = true;
        yVar15 = yajl_tok_double;
      }
      else {
        if (*offset < jsonTextLen) {
          do {
            puVar4 = jsonText;
            psVar11 = offset;
            if (((lexer->bufInUse != 0) && (sVar3 = yajl_buf_len(lexer->buf), sVar3 != 0)) &&
               (uVar7 = lexer->bufOff, sVar3 = yajl_buf_len(lexer->buf), uVar7 < sVar3)) {
              puVar4 = yajl_buf_data(lexer->buf);
              psVar11 = &lexer->bufOff;
            }
            sVar3 = *psVar11;
            *psVar11 = sVar3 + 1;
            bVar2 = puVar4[sVar3];
            if (9 < (byte)(bVar2 - 0x30)) goto LAB_0010381f;
          } while (*offset < jsonTextLen);
        }
        bVar20 = false;
        yVar15 = yajl_tok_integer;
      }
    }
    else {
LAB_00103858:
      local_60 = yVar15;
      yVar15 = yajl_tok_integer;
      bVar20 = false;
    }
    if (!bVar20) goto LAB_00103336;
  }
  local_60 = yVar15;
  if ((bVar2 & 0xdf) == 0x45) {
    if (jsonTextLen <= *offset) goto LAB_00103331;
    puVar4 = jsonText;
    psVar11 = offset;
    if (((lexer->bufInUse != 0) && (sVar3 = yajl_buf_len(lexer->buf), sVar3 != 0)) &&
       (uVar7 = lexer->bufOff, sVar3 = yajl_buf_len(lexer->buf), uVar7 < sVar3)) {
      psVar11 = &lexer->bufOff;
      puVar4 = yajl_buf_data(lexer->buf);
    }
    sVar3 = *psVar11;
    *psVar11 = sVar3 + 1;
    uVar1 = puVar4[sVar3];
    if ((uVar1 == '-') || (uVar1 == '+')) {
      if (jsonTextLen <= *offset) goto LAB_00103331;
      puVar4 = jsonText;
      psVar11 = offset;
      if (((lexer->bufInUse != 0) && (sVar3 = yajl_buf_len(lexer->buf), sVar3 != 0)) &&
         (uVar7 = lexer->bufOff, sVar3 = yajl_buf_len(lexer->buf), uVar7 < sVar3)) {
        psVar11 = &lexer->bufOff;
        puVar4 = yajl_buf_data(lexer->buf);
      }
      sVar3 = *psVar11;
      *psVar11 = sVar3 + 1;
      uVar1 = puVar4[sVar3];
    }
    if (9 < (byte)(uVar1 - 0x30)) {
      sVar3 = *offset;
      psVar11 = offset;
      if (sVar3 == 0) {
        psVar11 = &lexer->bufOff;
        sVar3 = lexer->bufOff;
      }
      *psVar11 = sVar3 - 1;
      lexer->error = yajl_lex_missing_integer_after_exponent;
LAB_001040d2:
      local_60 = yajl_tok_error;
      goto LAB_00103336;
    }
    do {
      if (jsonTextLen <= *offset) goto LAB_00103331;
      puVar4 = jsonText;
      psVar11 = offset;
      if (((lexer->bufInUse != 0) && (sVar3 = yajl_buf_len(lexer->buf), sVar3 != 0)) &&
         (uVar7 = lexer->bufOff, sVar3 = yajl_buf_len(lexer->buf), uVar7 < sVar3)) {
        puVar4 = yajl_buf_data(lexer->buf);
        psVar11 = &lexer->bufOff;
      }
      sVar3 = *psVar11;
      *psVar11 = sVar3 + 1;
    } while ((byte)(puVar4[sVar3] - 0x30) < 10);
    local_60 = yajl_tok_double;
  }
  if (*offset == 0) {
    lexer->bufOff = lexer->bufOff - 1;
  }
  else {
    *offset = *offset - 1;
  }
  goto LAB_00103336;
LAB_001038b7:
  do {
    if (((lexer->bufInUse == 0) || (sVar3 = yajl_buf_len(lexer->buf), sVar3 == 0)) ||
       (uVar7 = lexer->bufOff, sVar3 = yajl_buf_len(lexer->buf), sVar3 <= uVar7)) {
      uVar7 = *offset;
      pcVar9 = (char *)(jsonTextLen - uVar7);
      if (uVar7 <= jsonTextLen && (size_t *)pcVar9 != (size_t *)0x0) {
        if ((size_t *)pcVar9 == (size_t *)0x0) {
          psVar10 = (size_t *)0x0;
        }
        else {
          psVar18 = (size_t *)0x0;
          do {
            psVar10 = psVar18;
            if ((byte)(((lexer->validateUTF8 != 0) << 4 | 10U) &
                      "\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02"
                      [(jsonText + uVar7)[(long)psVar18]]) != 0) break;
            psVar18 = (size_t *)((long)psVar18 + 1);
            psVar10 = (size_t *)pcVar9;
          } while ((size_t *)pcVar9 != psVar18);
        }
        *offset = (long)psVar10 + uVar7;
      }
    }
    else {
      puVar4 = yajl_buf_data(lexer->buf);
      sVar3 = lexer->bufOff;
      sVar6 = yajl_buf_len(lexer->buf);
      pcVar9 = (char *)lexer->bufOff;
      lVar14 = sVar6 - (long)pcVar9;
      if (lVar14 == 0) {
        lVar17 = 0;
      }
      else {
        lVar16 = 0;
        do {
          lVar17 = lVar16;
          if ((byte)(((lexer->validateUTF8 != 0) << 4 | 10U) &
                    "\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02"
                    [puVar4[lVar16 + sVar3]]) != 0) break;
          lVar16 = lVar16 + 1;
          lVar17 = lVar14;
        } while (lVar14 != lVar16);
      }
      *psVar11 = lVar17 + (long)pcVar9;
    }
    iVar12 = 4;
    if (*offset < jsonTextLen) {
      puVar4 = jsonText;
      psVar10 = offset;
      if (((lexer->bufInUse != 0) && (sVar3 = yajl_buf_len(lexer->buf), sVar3 != 0)) &&
         (uVar7 = lexer->bufOff, sVar3 = yajl_buf_len(lexer->buf), uVar7 < sVar3)) {
        puVar4 = yajl_buf_data(lexer->buf);
        psVar10 = psVar11;
      }
      pcVar9 = (char *)*psVar10;
      *psVar10 = (size_t)((long)pcVar9 + 1);
      bVar2 = puVar4[(long)pcVar9];
      if ((ulong)bVar2 == 0x22) {
        iVar12 = 2;
        local_70 = yajl_tok_string;
      }
      else {
        pcVar9 = 
        "\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02"
        ;
        if (bVar2 == 0x5c) {
          bVar20 = true;
          if (jsonTextLen <= *offset) goto LAB_00103b6e;
          puVar4 = jsonText;
          psVar10 = offset;
          if (((lexer->bufInUse != 0) && (sVar3 = yajl_buf_len(lexer->buf), sVar3 != 0)) &&
             (uVar7 = lexer->bufOff, sVar3 = yajl_buf_len(lexer->buf), uVar7 < sVar3)) {
            puVar4 = yajl_buf_data(lexer->buf);
            psVar10 = psVar11;
          }
          sVar3 = *psVar10;
          *psVar10 = sVar3 + 1;
          if ((ulong)puVar4[sVar3] == 0x75) {
            pcVar9 = (char *)0x0;
            uVar8 = 0;
            do {
              iVar12 = 4;
              if (jsonTextLen <= *offset) {
                local_70 = yajl_tok_eof;
                goto LAB_00103d43;
              }
              puVar4 = jsonText;
              psVar10 = offset;
              if (((lexer->bufInUse != 0) && (sVar3 = yajl_buf_len(lexer->buf), sVar3 != 0)) &&
                 (uVar7 = lexer->bufOff, sVar3 = yajl_buf_len(lexer->buf), uVar7 < sVar3)) {
                puVar4 = yajl_buf_data(lexer->buf);
                psVar10 = psVar11;
              }
              sVar3 = *psVar10;
              *psVar10 = sVar3 + 1;
              if (("\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02"
                   [puVar4[sVar3]] & 4U) == 0) {
                sVar3 = *offset;
                psVar10 = offset;
                if (sVar3 == 0) {
                  sVar3 = *psVar11;
                  psVar10 = psVar11;
                }
                *psVar10 = sVar3 - 1;
                lexer->error = yajl_lex_string_invalid_hex_char;
                iVar12 = 4;
                goto LAB_00103d43;
              }
              bVar20 = 2 < uVar8;
              uVar8 = uVar8 + 1;
              pcVar9 = (char *)CONCAT71(0x1062,bVar20);
            } while (uVar8 != 4);
            iVar12 = 0;
LAB_00103d43:
            bVar20 = true;
            if (((ulong)pcVar9 & 1) != 0) {
LAB_00103cf7:
              iVar12 = 0;
            }
          }
          else {
            bVar20 = true;
            pcVar9 = 
            "\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02"
            ;
            if (("\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02"
                 [puVar4[sVar3]] & 1U) != 0) goto LAB_00103cf7;
            sVar3 = *offset;
            pcVar9 = (char *)offset;
            if (sVar3 == 0) {
              sVar3 = *psVar11;
              pcVar9 = (char *)psVar11;
            }
            *(size_t *)pcVar9 = sVar3 - 1;
            lexer->error = yajl_lex_string_invalid_escaped_char;
            bVar20 = true;
          }
        }
        else if (("\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02\x02"
                  [bVar2] & 2U) == 0) {
          if (lexer->validateUTF8 == 0) goto LAB_00103cf7;
          iVar13 = 0xc;
          if ((char)bVar2 < '\0') {
            uVar8 = bVar2 & 0xffffffe0;
            pcVar9 = (char *)(ulong)uVar8;
            if (uVar8 == 0xc0) {
              iVar13 = 3;
              if (jsonTextLen <= *offset) goto LAB_00103bab;
              psVar10 = offset;
              if (((lexer->bufInUse != 0) && (sVar3 = yajl_buf_len(lexer->buf), sVar3 != 0)) &&
                 (uVar7 = lexer->bufOff, sVar3 = yajl_buf_len(lexer->buf), uVar7 < sVar3)) {
                yajl_buf_data(lexer->buf);
                psVar10 = psVar11;
              }
              pcVar9 = (char *)*psVar10;
              *psVar10 = (size_t)((long)pcVar9 + 1);
            }
            else {
              uVar8 = bVar2 & 0xfffffff0;
              pcVar9 = (char *)(ulong)uVar8;
              if (uVar8 == 0xe0) {
                iVar13 = 3;
                if (jsonTextLen <= *offset) goto LAB_00103bab;
                psVar10 = offset;
                if (((lexer->bufInUse != 0) && (sVar3 = yajl_buf_len(lexer->buf), sVar3 != 0)) &&
                   (uVar7 = lexer->bufOff, sVar3 = yajl_buf_len(lexer->buf), uVar7 < sVar3)) {
                  yajl_buf_data(lexer->buf);
                  psVar10 = psVar11;
                }
                pcVar9 = (char *)*psVar10;
                *psVar10 = (size_t)((long)pcVar9 + 1);
              }
              else if ((bVar2 & 0xfffffff8) == 0xf0) {
                iVar13 = 3;
                if (jsonTextLen <= *offset) goto LAB_00103bab;
                psVar10 = offset;
                if (((lexer->bufInUse != 0) && (sVar3 = yajl_buf_len(lexer->buf), sVar3 != 0)) &&
                   (uVar7 = lexer->bufOff, sVar3 = yajl_buf_len(lexer->buf), uVar7 < sVar3)) {
                  yajl_buf_data(lexer->buf);
                  psVar10 = psVar11;
                }
                pcVar9 = (char *)*psVar10;
                *psVar10 = (size_t)((long)pcVar9 + 1);
              }
            }
            iVar13 = 4;
          }
LAB_00103bab:
          iVar12 = 4;
          if (iVar13 == 3) {
            bVar21 = false;
            local_70 = yajl_tok_eof;
            iVar12 = 4;
          }
          else {
            bVar21 = iVar13 != 4;
            if (bVar21) {
              iVar12 = 0;
            }
            else {
              lexer->error = yajl_lex_string_invalid_utf8;
            }
          }
          if (bVar21) goto LAB_00103cf7;
        }
        else {
          sVar3 = *offset;
          pcVar9 = (char *)offset;
          if (sVar3 == 0) {
            sVar3 = *psVar11;
            pcVar9 = (char *)psVar11;
          }
          *(size_t *)pcVar9 = sVar3 - 1;
          lexer->error = yajl_lex_string_invalid_json_char;
        }
      }
    }
    else {
LAB_00103b6e:
      local_70 = yajl_tok_eof;
    }
    local_60 = (yajl_tok)pcVar9;
  } while (iVar12 == 0);
  if ((iVar12 == 4) || (iVar12 == 2)) {
    local_60 = yajl_tok_string_with_escapes;
    if (local_70 != yajl_tok_string) {
      local_60 = local_70;
    }
    if (!bVar20) {
      local_60 = local_70;
    }
  }
LAB_00103336:
  if ((local_60 == yajl_tok_eof) || (lexer->bufInUse != 0)) {
    if (lexer->bufInUse == 0) {
      yajl_buf_clear(lexer->buf);
    }
    lexer->bufInUse = 1;
    yajl_buf_append(lexer->buf,jsonText + sVar5,*offset - sVar5);
    lexer->bufOff = 0;
    if (local_60 != yajl_tok_eof) {
      puVar4 = yajl_buf_data(lexer->buf);
      *outBuf = puVar4;
      sVar5 = yajl_buf_len(lexer->buf);
      *outLen = sVar5;
      lexer->bufInUse = 0;
    }
  }
  else if (local_60 != yajl_tok_error) {
    *outBuf = jsonText + sVar5;
    *outLen = *offset - sVar5;
  }
  if ((local_60 & ~yajl_tok_colon) == yajl_tok_string) {
    *outBuf = *outBuf + 1;
    *outLen = *outLen - 2;
  }
  return local_60;
}

Assistant:

yajl_tok
yajl_lex_lex(yajl_lexer lexer, const unsigned char * jsonText,
             size_t jsonTextLen, size_t * offset,
             const unsigned char ** outBuf, size_t * outLen)
{
    yajl_tok tok = yajl_tok_error;
    unsigned char c;
    size_t startOffset = *offset;

    *outBuf = NULL;
    *outLen = 0;

    for (;;) {
        assert(*offset <= jsonTextLen);

        if (*offset >= jsonTextLen) {
            tok = yajl_tok_eof;
            goto lexed;
        }

        c = readChar(lexer, jsonText, offset);

        switch (c) {
            case '{':
                tok = yajl_tok_left_bracket;
                goto lexed;
            case '}':
                tok = yajl_tok_right_bracket;
                goto lexed;
            case '[':
                tok = yajl_tok_left_brace;
                goto lexed;
            case ']':
                tok = yajl_tok_right_brace;
                goto lexed;
            case ',':
                tok = yajl_tok_comma;
                goto lexed;
            case ':':
                tok = yajl_tok_colon;
                goto lexed;
            case '\t': case '\n': case '\v': case '\f': case '\r': case ' ':
                startOffset++;
                break;
            case 't': {
                const char * want = "rue";
                do {
                    if (*offset >= jsonTextLen) {
                        tok = yajl_tok_eof;
                        goto lexed;
                    }
                    c = readChar(lexer, jsonText, offset);
                    if (c != *want) {
                        unreadChar(lexer, offset);
                        lexer->error = yajl_lex_invalid_string;
                        tok = yajl_tok_error;
                        goto lexed;
                    }
                } while (*(++want));
                tok = yajl_tok_bool;
                goto lexed;
            }
            case 'f': {
                const char * want = "alse";
                do {
                    if (*offset >= jsonTextLen) {
                        tok = yajl_tok_eof;
                        goto lexed;
                    }
                    c = readChar(lexer, jsonText, offset);
                    if (c != *want) {
                        unreadChar(lexer, offset);
                        lexer->error = yajl_lex_invalid_string;
                        tok = yajl_tok_error;
                        goto lexed;
                    }
                } while (*(++want));
                tok = yajl_tok_bool;
                goto lexed;
            }
            case 'n': {
                const char * want = "ull";
                do {
                    if (*offset >= jsonTextLen) {
                        tok = yajl_tok_eof;
                        goto lexed;
                    }
                    c = readChar(lexer, jsonText, offset);
                    if (c != *want) {
                        unreadChar(lexer, offset);
                        lexer->error = yajl_lex_invalid_string;
                        tok = yajl_tok_error;
                        goto lexed;
                    }
                } while (*(++want));
                tok = yajl_tok_null;
                goto lexed;
            }
            case '"': {
                tok = yajl_lex_string(lexer, (const unsigned char *) jsonText,
                                      jsonTextLen, offset);
                goto lexed;
            }
            case '-':
            case '0': case '1': case '2': case '3': case '4':
            case '5': case '6': case '7': case '8': case '9': {
                /* integer parsing wants to start from the beginning */
                unreadChar(lexer, offset);
                tok = yajl_lex_number(lexer, (const unsigned char *) jsonText,
                                      jsonTextLen, offset);
                goto lexed;
            }
            case '/':
                /* hey, look, a probable comment!  If comments are disabled
                 * it's an error. */
                if (!lexer->allowComments) {
                    unreadChar(lexer, offset);
                    lexer->error = yajl_lex_unallowed_comment;
                    tok = yajl_tok_error;
                    goto lexed;
                }
                /* if comments are enabled, then we should try to lex
                 * the thing.  possible outcomes are
                 * - successful lex (tok_comment, which means continue),
                 * - malformed comment opening (slash not followed by
                 *   '*' or '/') (tok_error)
                 * - eof hit. (tok_eof) */
                tok = yajl_lex_comment(lexer, (const unsigned char *) jsonText,
                                       jsonTextLen, offset);
                if (tok == yajl_tok_comment) {
                    /* "error" is silly, but that's the initial
                     * state of tok.  guilty until proven innocent. */
                    tok = yajl_tok_error;
                    yajl_buf_clear(lexer->buf);
                    lexer->bufInUse = 0;
                    startOffset = *offset;
                    break;
                }
                /* hit error or eof, bail */
                goto lexed;
            default:
                lexer->error = yajl_lex_invalid_char;
                tok = yajl_tok_error;
                goto lexed;
        }
    }


  lexed:
    /* need to append to buffer if the buffer is in use or
     * if it's an EOF token */
    if (tok == yajl_tok_eof || lexer->bufInUse) {
        if (!lexer->bufInUse) yajl_buf_clear(lexer->buf);
        lexer->bufInUse = 1;
        yajl_buf_append(lexer->buf, jsonText + startOffset, *offset - startOffset);
        lexer->bufOff = 0;

        if (tok != yajl_tok_eof) {
            *outBuf = yajl_buf_data(lexer->buf);
            *outLen = yajl_buf_len(lexer->buf);
            lexer->bufInUse = 0;
        }
    } else if (tok != yajl_tok_error) {
        *outBuf = jsonText + startOffset;
        *outLen = *offset - startOffset;
    }

    /* special case for strings. skip the quotes. */
    if (tok == yajl_tok_string || tok == yajl_tok_string_with_escapes)
    {
        assert(*outLen >= 2);
        (*outBuf)++;
        *outLen -= 2;
    }


#ifdef YAJL_LEXER_DEBUG
    if (tok == yajl_tok_error) {
        printf("lexical error: %s\n",
               yajl_lex_error_to_string(yajl_lex_get_error(lexer)));
    } else if (tok == yajl_tok_eof) {
        printf("EOF hit\n");
    } else {
        printf("lexed %s: '", tokToStr(tok));
        fwrite(*outBuf, 1, *outLen, stdout);
        printf("'\n");
    }
#endif

    return tok;
}